

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Params *params)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  FieldDescriptor *field;
  FieldGenerator *p;
  scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *psVar6;
  ulong uVar7;
  byte local_a1;
  scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *local_78;
  FieldGenerator *field_generator;
  int i;
  bool saved_defaults_needed;
  int next_has_bit_index;
  Params *local_20;
  Params *params_local;
  Descriptor *descriptor_local;
  FieldGeneratorMap *this_local;
  
  this->descriptor_ = descriptor;
  local_20 = params;
  params_local = (Params *)descriptor;
  descriptor_local = (Descriptor *)this;
  iVar2 = Descriptor::field_count(descriptor);
  uVar3 = (ulong)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  psVar6 = (scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_78 = psVar6;
    do {
      internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>::scoped_ptr
                (local_78,(FieldGenerator *)0x0);
      local_78 = local_78 + 1;
    } while (local_78 != psVar6 + uVar3);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
  ::scoped_array(&this->field_generators_,psVar6);
  i = 0;
  field_generator._7_1_ = false;
  field_generator._0_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::field_count((Descriptor *)params_local);
    if (iVar2 <= (int)field_generator) break;
    field = Descriptor::field((Descriptor *)params_local,(int)field_generator);
    p = MakeGenerator(field,local_20,&i);
    local_a1 = 1;
    if (field_generator._7_1_ == false) {
      iVar2 = (*p->_vptr_FieldGenerator[2])();
      local_a1 = (byte)iVar2;
    }
    field_generator._7_1_ = (bool)(local_a1 & 1);
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
             ::operator[](&this->field_generators_,(long)(int)field_generator);
    internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>::reset(psVar6,p);
    field_generator._0_4_ = (int)field_generator + 1;
  }
  this->total_bits_ = i;
  this->saved_defaults_needed_ = field_generator._7_1_;
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(
    const Descriptor* descriptor, const Params &params)
  : descriptor_(descriptor),
    field_generators_(
      new scoped_ptr<FieldGenerator>[descriptor->field_count()]) {

  int next_has_bit_index = 0;
  bool saved_defaults_needed = false;
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    FieldGenerator* field_generator = MakeGenerator(
        descriptor->field(i), params, &next_has_bit_index);
    saved_defaults_needed = saved_defaults_needed
        || field_generator->SavedDefaultNeeded();
    field_generators_[i].reset(field_generator);
  }
  total_bits_ = next_has_bit_index;
  saved_defaults_needed_ = saved_defaults_needed;
}